

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpActionComplete.c
# Opt level: O0

int UpnpActionComplete_assign(UpnpActionComplete *p,UpnpActionComplete *q)

{
  int iVar1;
  UpnpString *s;
  IXML_Document *pIVar2;
  bool bVar3;
  bool bVar4;
  undefined1 local_49;
  undefined4 local_1c;
  int ok;
  UpnpActionComplete *q_local;
  UpnpActionComplete *p_local;
  
  local_1c = 1;
  if (p != q) {
    iVar1 = UpnpActionComplete_get_ErrCode(q);
    iVar1 = UpnpActionComplete_set_ErrCode(p,iVar1);
    bVar3 = false;
    if (iVar1 != 0) {
      s = UpnpActionComplete_get_CtrlUrl(q);
      iVar1 = UpnpActionComplete_set_CtrlUrl(p,s);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      pIVar2 = UpnpActionComplete_get_ActionRequest(q);
      iVar1 = UpnpActionComplete_set_ActionRequest(p,pIVar2);
      bVar4 = iVar1 != 0;
    }
    local_49 = false;
    if (bVar4) {
      pIVar2 = UpnpActionComplete_get_ActionResult(q);
      iVar1 = UpnpActionComplete_set_ActionResult(p,pIVar2);
      local_49 = iVar1 != 0;
    }
    local_1c = (uint)local_49;
  }
  return local_1c;
}

Assistant:

int UpnpActionComplete_assign(
	UpnpActionComplete *p, const UpnpActionComplete *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpActionComplete_set_ErrCode(
				   p, UpnpActionComplete_get_ErrCode(q));
		ok = ok && UpnpActionComplete_set_CtrlUrl(
				   p, UpnpActionComplete_get_CtrlUrl(q));
		ok = ok && UpnpActionComplete_set_ActionRequest(
				   p, UpnpActionComplete_get_ActionRequest(q));
		ok = ok && UpnpActionComplete_set_ActionResult(
				   p, UpnpActionComplete_get_ActionResult(q));
	}

	return ok;
}